

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxSwitchStatement::Emit(FxSwitchStatement *this,VMFunctionBuilder *build)

{
  FxExpression *this_00;
  FxJumpStatement **ppFVar1;
  int opcode;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  ExpEmit EVar5;
  FxExpression **ppFVar6;
  VM_SHALF opbc;
  bool bVar7;
  CaseAddr *ca;
  CaseAddr *pCVar8;
  long lVar9;
  FxExpression **ppFVar10;
  
  if (this->Condition == (FxExpression *)0x0) {
    __assert_fail("Condition != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x222f,"virtual ExpEmit FxSwitchStatement::Emit(VMFunctionBuilder *)");
  }
  uVar2 = (*this->Condition->_vptr_FxExpression[9])();
  if ((uVar2 & 0xff0000) != 0) {
    __assert_fail("emit.RegType == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x2231,"virtual ExpEmit FxSwitchStatement::Emit(VMFunctionBuilder *)");
  }
  pCVar8 = (this->CaseAddresses).Array;
  lVar9 = (ulong)(this->CaseAddresses).Count << 4;
  do {
    if (lVar9 == 0) {
      bVar7 = false;
      sVar4 = VMFunctionBuilder::Emit(build,0x44,0);
      ppFVar6 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array;
      ppFVar10 = ppFVar6 + (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Count;
      do {
        if (ppFVar6 == ppFVar10) {
          ppFVar1 = (this->Breaks).Array;
          uVar2 = (this->Breaks).Count;
          for (lVar9 = 0; (ulong)uVar2 << 3 != lVar9; lVar9 = lVar9 + 8) {
            VMFunctionBuilder::BackpatchToHere
                      (build,*(size_t *)(*(long *)((long)ppFVar1 + lVar9) + 0x30));
          }
          if (!bVar7) {
            VMFunctionBuilder::BackpatchToHere(build,sVar4);
          }
          TDeletingArray<FxExpression_*,_FxExpression_*>::DeleteAndClear(&this->Content);
          TArray<FxExpression_*,_FxExpression_*>::ShrinkToFit
                    (&(this->Content).super_TArray<FxExpression_*,_FxExpression_*>);
          EVar5.RegNum = 0;
          EVar5.RegType = 0x80;
          EVar5.RegCount = '\x01';
          EVar5.Konst = false;
          EVar5.Fixed = false;
          EVar5.Final = false;
          EVar5.Target = false;
          return EVar5;
        }
        this_00 = *ppFVar6;
        if (this_00->ExprType == EFX_CaseStatement) {
          if (this_00[1]._vptr_FxExpression == (_func_int **)0x0) {
            VMFunctionBuilder::BackpatchToHere(build,sVar4);
            bVar7 = true;
          }
          else {
            pCVar8 = (this->CaseAddresses).Array;
            for (lVar9 = 0; (ulong)(this->CaseAddresses).Count << 4 != lVar9; lVar9 = lVar9 + 0x10)
            {
              if (*(int *)((long)&pCVar8->casevalue + lVar9) ==
                  *(int *)&this_00[1].ScriptPosition.FileName.Chars) {
                VMFunctionBuilder::BackpatchToHere
                          (build,*(size_t *)((long)&pCVar8->jumpaddress + lVar9));
                break;
              }
            }
          }
        }
        else {
          FxExpression::EmitStatement(this_00,build);
        }
        ppFVar6 = ppFVar6 + 1;
      } while( true );
    }
    uVar3 = pCVar8->casevalue;
    opbc = (VM_SHALF)uVar3;
    if (uVar3 < 0x10000) {
      opcode = 0x42;
LAB_005187b5:
      VMFunctionBuilder::Emit(build,opcode,uVar2 & 0xffff,opbc);
    }
    else {
      if (0xffff0000 < uVar3) {
        opbc = -opbc;
        opcode = 0x43;
        goto LAB_005187b5;
      }
      uVar3 = VMFunctionBuilder::GetConstantInt(build,uVar3);
      VMFunctionBuilder::Emit(build,0x8a,1,uVar2 & 0xffff,uVar3);
    }
    sVar4 = VMFunctionBuilder::Emit(build,0x44,0);
    pCVar8->jumpaddress = sVar4;
    pCVar8 = pCVar8 + 1;
    lVar9 = lVar9 + -0x10;
  } while( true );
}

Assistant:

ExpEmit FxSwitchStatement::Emit(VMFunctionBuilder *build)
{
	assert(Condition != nullptr);
	ExpEmit emit = Condition->Emit(build);
	assert(emit.RegType == REGT_INT);
	// todo: 
	// - sort jump table by value.
	// - optimize the switch dispatcher to run in native code instead of executing each single branch instruction on its own.
	// e.g.: build->Emit(OP_SWITCH, emit.RegNum, build->GetConstantInt(CaseAddresses.Size());
	for (auto &ca : CaseAddresses)
	{
		if (ca.casevalue >= 0 && ca.casevalue <= 0xffff)
		{
			build->Emit(OP_TEST, emit.RegNum, (VM_SHALF)ca.casevalue);
		}
		else if (ca.casevalue < 0 && ca.casevalue >= -0xffff)
		{
			build->Emit(OP_TESTN, emit.RegNum, (VM_SHALF)-ca.casevalue);
		}
		else
		{
			build->Emit(OP_EQ_K, 1, emit.RegNum, build->GetConstantInt(ca.casevalue));
		}
		ca.jumpaddress = build->Emit(OP_JMP, 0);
	}
	size_t DefaultAddress = build->Emit(OP_JMP, 0);
	bool defaultset = false;

	for (auto line : Content)
	{
		switch (line->ExprType)
		{
		case EFX_CaseStatement:
			if (static_cast<FxCaseStatement *>(line)->Condition != nullptr)
			{
				for (auto &ca : CaseAddresses)
				{
					if (ca.casevalue == static_cast<FxCaseStatement *>(line)->CaseValue)
					{
						build->BackpatchToHere(ca.jumpaddress);
						break;
					}
				}
			}
			else
			{
				build->BackpatchToHere(DefaultAddress);
				defaultset = true;
			}
			break;

		default:
			line->EmitStatement(build);
			break;
		}
	}
	for (auto addr : Breaks)
	{
		build->BackpatchToHere(addr->Address);
	}
	if (!defaultset) build->BackpatchToHere(DefaultAddress);
	Content.DeleteAndClear();
	Content.ShrinkToFit();
	return ExpEmit();
}